

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall OStream_LargeSpan_Test::TestBody(OStream_LargeSpan_Test *this)

{
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *pMVar1;
  span<const_char,_7L> s;
  WithoutMatchers local_311;
  Matcher<unsigned_long> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  first_elements_are local_2d8;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  local_2b8;
  Matcher<const_std::vector<char,_std::allocator<char>_>_&> local_298;
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> local_280;
  WithoutMatchers local_241;
  Matcher<unsigned_long> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  first_elements_are local_208;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  local_1e8;
  Matcher<const_std::vector<char,_std::allocator<char>_>_&> local_1c8;
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> local_1b0;
  WithoutMatchers local_171;
  Matcher<unsigned_long> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  first_elements_are local_138;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  local_118;
  Matcher<const_std::vector<char,_std::allocator<char>_>_&> local_f8;
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> local_e0;
  InSequence local_91;
  undefined1 local_90 [7];
  InSequence seq;
  test_ostream str;
  array<const_char,_7UL> v;
  OStream_LargeSpan_Test *this_local;
  
  str.gmock02_flush_buffer_96.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_3_ = 0x676665;
  str.gmock02_flush_buffer_96.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x64636261;
  anon_unknown.dwarf_131826::test_ostream::test_ostream((test_ostream *)local_90);
  testing::InSequence::InSequence(&local_91);
  s_abi_cxx11_(&local_158,"abc",3);
  anon_unknown.dwarf_131826::first_elements_are::first_elements_are(&local_138,&local_158);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_118,&local_138);
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_f8,(PolymorphicMatcher *)&local_118);
  testing::Matcher<unsigned_long>::Matcher(&local_170,3);
  anon_unknown.dwarf_131826::test_ostream::gmock_flush_buffer
            (&local_e0,(test_ostream *)local_90,&local_f8,&local_170);
  testing::internal::GetWithoutMatchers();
  pMVar1 = testing::internal::
           MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
           operator()(&local_e0,&local_171,(void *)0x0);
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(pMVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xae,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"abc\"s}), test_ostream::buffer_size)"
                    );
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::~MockSpec
            (&local_e0);
  testing::Matcher<unsigned_long>::~Matcher(&local_170);
  testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>::~Matcher(&local_f8);
  testing::
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
  ~PolymorphicMatcher(&local_118);
  anon_unknown.dwarf_131826::first_elements_are::~first_elements_are(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  s_abi_cxx11_(&local_228,"def",3);
  anon_unknown.dwarf_131826::first_elements_are::first_elements_are(&local_208,&local_228);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_1e8,&local_208);
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_1c8,(PolymorphicMatcher *)&local_1e8)
  ;
  testing::Matcher<unsigned_long>::Matcher(&local_240,3);
  anon_unknown.dwarf_131826::test_ostream::gmock_flush_buffer
            (&local_1b0,(test_ostream *)local_90,&local_1c8,&local_240);
  testing::internal::GetWithoutMatchers();
  pMVar1 = testing::internal::
           MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
           operator()(&local_1b0,&local_241,(void *)0x0);
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(pMVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb0,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"def\"s}), test_ostream::buffer_size)"
                    );
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::~MockSpec
            (&local_1b0);
  testing::Matcher<unsigned_long>::~Matcher(&local_240);
  testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>::~Matcher(&local_1c8);
  testing::
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
  ~PolymorphicMatcher(&local_1e8);
  anon_unknown.dwarf_131826::first_elements_are::~first_elements_are(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  s_abi_cxx11_(&local_2f8,"g",1);
  anon_unknown.dwarf_131826::first_elements_are::first_elements_are(&local_2d8,&local_2f8);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_2b8,&local_2d8);
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_298,(PolymorphicMatcher *)&local_2b8)
  ;
  testing::Matcher<unsigned_long>::Matcher(&local_310,1);
  anon_unknown.dwarf_131826::test_ostream::gmock_flush_buffer
            (&local_280,(test_ostream *)local_90,&local_298,&local_310);
  testing::internal::GetWithoutMatchers();
  pMVar1 = testing::internal::
           MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
           operator()(&local_280,&local_311,(void *)0x0);
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(pMVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb1,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"g\"s}), std::size_t{1})");
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::~MockSpec
            (&local_280);
  testing::Matcher<unsigned_long>::~Matcher(&local_310);
  testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>::~Matcher(&local_298);
  testing::
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
  ~PolymorphicMatcher(&local_2b8);
  anon_unknown.dwarf_131826::first_elements_are::~first_elements_are(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  s = pstore::gsl::make_span<char_const,7ul>
                ((array<const_char,_7UL> *)
                 ((long)&str.gmock02_flush_buffer_96.super_UntypedFunctionMockerBase.
                         untyped_expectations_.
                         super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                         ._M_impl.super__Vector_impl_data + 0x10));
  pstore::exchange::export_ns::ostream_base::write<7l>((ostream_base *)local_90,s);
  pstore::exchange::export_ns::ostream_base::flush((ostream_base *)local_90);
  testing::InSequence::~InSequence(&local_91);
  anon_unknown.dwarf_131826::test_ostream::~test_ostream((test_ostream *)local_90);
  return;
}

Assistant:

TEST (OStream, LargeSpan) {
    std::array<char const, 7U> const v{{'a', 'b', 'c', 'd', 'e', 'f', 'g'}};

    test_ostream str;

    // TODO: here the code could optimize the case where more than a buffer's worth of data is
    // being written.
    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"def"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"g"s}), std::size_t{1}));

    str.write (pstore::gsl::make_span (v));
    str.flush ();
}